

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O3

bool cmFileSet::IsValidName(string *name)

{
  bool bVar1;
  int iVar2;
  RegularExpressionMatch match;
  RegularExpressionMatch RStack_218;
  
  if (IsValidName(std::__cxx11::string_const&)::regex == '\0') {
    iVar2 = __cxa_guard_acquire(&IsValidName(std::__cxx11::string_const&)::regex);
    if (iVar2 != 0) {
      IsValidName::regex.regmust = (char *)0x0;
      IsValidName::regex.program = (char *)0x0;
      IsValidName::regex.progsize = 0;
      memset(&IsValidName::regex,0,0x20a);
      cmsys::RegularExpression::compile(&IsValidName::regex,"^[a-z0-9][a-zA-Z0-9_]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&IsValidName::regex,&__dso_handle);
      __cxa_guard_release(&IsValidName(std::__cxx11::string_const&)::regex);
    }
  }
  memset(&RStack_218,0,0x208);
  bVar1 = cmsys::RegularExpression::find(&IsValidName::regex,(name->_M_dataplus)._M_p,&RStack_218);
  return bVar1;
}

Assistant:

bool cmFileSet::IsValidName(const std::string& name)
{
  static const cmsys::RegularExpression regex("^[a-z0-9][a-zA-Z0-9_]*$");

  cmsys::RegularExpressionMatch match;
  return regex.find(name.c_str(), match);
}